

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O2

TRef lj_opt_fwd_uload(jit_State *J)

{
  IRIns *refa;
  ushort uVar1;
  ushort uVar2;
  IRIns *pIVar3;
  AliasRet AVar4;
  uint uVar5;
  TRef TVar6;
  IRRef1 *pIVar7;
  uint uVar8;
  ulong uVar9;
  
  uVar1 = (J->fold).ins.field_0.op1;
  pIVar3 = (J->cur).ir;
  refa = pIVar3 + uVar1;
  pIVar7 = J->chain + 0x4c;
  while( true ) {
    uVar9 = (ulong)*pIVar7;
    uVar8 = (uint)*pIVar7;
    if (uVar9 < 0x8001) break;
    AVar4 = aa_uref(refa,pIVar3 + pIVar3[uVar9].field_0.op1);
    if (AVar4 == ALIAS_MAY) goto LAB_001510c0;
    if (AVar4 == ALIAS_MUST) {
      return (uint)(&pIVar3->field_0)[uVar9].op2;
    }
    pIVar7 = &(&pIVar3->field_0)[uVar9].prev;
  }
  uVar8 = 0x8000;
LAB_001510c0:
  pIVar7 = J->chain + 0x44;
  while( true ) {
    uVar5 = (uint)*pIVar7;
    if (uVar5 <= uVar8) {
      TVar6 = lj_ir_emit(J);
      return TVar6;
    }
    uVar2 = pIVar3[uVar5].field_0.op1;
    if ((uVar2 == uVar1) ||
       ((pIVar3[uVar2].field_1.op12 == (refa->field_1).op12 &&
        (*(IROp1 *)((long)pIVar3 + (ulong)uVar2 * 8 + 5) == (refa->field_1).o)))) break;
    pIVar7 = &(&pIVar3->field_0)[uVar5].prev;
  }
  return (uint)*pIVar7;
}

Assistant:

TRef LJ_FASTCALL lj_opt_fwd_uload(jit_State *J)
{
  IRRef uref = fins->op1;
  IRRef lim = REF_BASE;  /* Search limit. */
  IRIns *xr = IR(uref);
  IRRef ref;

  /* Search for conflicting stores. */
  ref = J->chain[IR_USTORE];
  while (ref > lim) {
    IRIns *store = IR(ref);
    switch (aa_uref(xr, IR(store->op1))) {
    case ALIAS_NO:   break;  /* Continue searching. */
    case ALIAS_MAY:  lim = ref; goto cselim;  /* Limit search for load. */
    case ALIAS_MUST: return store->op2;  /* Store forwarding. */
    }
    ref = store->prev;
  }

cselim:
  /* Try to find a matching load. Below the conflicting store, if any. */
  ref = J->chain[IR_ULOAD];
  while (ref > lim) {
    IRIns *ir = IR(ref);
    if (ir->op1 == uref ||
	(IR(ir->op1)->op12 == IR(uref)->op12 && IR(ir->op1)->o == IR(uref)->o))
      return ref;  /* Match for identical or equal UREFx (non-CSEable UREFO). */
    ref = ir->prev;
  }
  return lj_ir_emit(J);
}